

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_>::freeData
          (Span<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *this)

{
  long lVar1;
  
  if (this->entries != (Entry *)0x0) {
    lVar1 = 0;
    do {
      if ((ulong)this->offsets[lVar1] != 0xff) {
        QVariant::~QVariant((QVariant *)(this->entries[this->offsets[lVar1]].storage.data + 8));
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }